

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econ.cpp
# Opt level: O2

int CEcon::DelClientCallback(int ClientID,char *pReason,void *pUser)

{
  long lVar1;
  long in_FS_OFFSET;
  char aBuf [256];
  char aAddrStr [48];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  net_addr_str((NETADDR *)((long)pUser + (long)ClientID * 0x6a8 + 0x94),aAddrStr,0x30,1);
  str_format(aBuf,0x100,"client dropped. cid=%d addr=%s reason=\'%s\'",(ulong)(uint)ClientID,
             aAddrStr,pReason);
  (**(code **)(**(long **)((long)pUser + 0x68) + 200))
            (*(long **)((long)pUser + 0x68),1,"econ",aBuf,0);
  *(undefined4 *)((long)pUser + (long)ClientID * 0x18) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int CEcon::DelClientCallback(int ClientID, const char *pReason, void *pUser)
{
	CEcon *pThis = (CEcon *)pUser;

	char aAddrStr[NETADDR_MAXSTRSIZE];
	net_addr_str(pThis->m_NetConsole.ClientAddr(ClientID), aAddrStr, sizeof(aAddrStr), true);
	char aBuf[256];
	str_format(aBuf, sizeof(aBuf), "client dropped. cid=%d addr=%s reason='%s'", ClientID, aAddrStr, pReason);
	pThis->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "econ", aBuf);

	pThis->m_aClients[ClientID].m_State = CClient::STATE_EMPTY;
	return 0;
}